

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  bool bVar1;
  string *psVar2;
  string *this;
  CodedInputStream *in_RSI;
  uint32 length;
  int in_stack_0000003c;
  string *in_stack_00000040;
  CodedInputStream *in_stack_00000048;
  bool local_39;
  string *value;
  
  value = (string *)in_RSI->buffer_;
  psVar2 = GetEmptyStringAlreadyInited_abi_cxx11_();
  if (value == psVar2) {
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string(this);
    in_RSI->buffer_ = (uint8 *)this;
  }
  bVar1 = io::CodedInputStream::ReadVarint32(in_RSI,(uint32 *)value);
  local_39 = false;
  if (bVar1) {
    local_39 = io::CodedInputStream::ReadString
                         (in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  }
  return local_39;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, std::string** p) {
  if (*p == &GetEmptyStringAlreadyInited()) {
    *p = new std::string();
  }
  return ReadBytesToString(input, *p);
}